

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbTest.c
# Opt level: O1

int Acb_NtkCheckPiOrder(Acb_Ntk_t *pNtkF,Acb_Ntk_t *pNtkG)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *__s1;
  char *__s2;
  long lVar4;
  
  iVar1 = (pNtkF->vCis).nSize;
  if ((long)iVar1 < 1) {
    lVar4 = 0;
  }
  else {
    lVar4 = 0;
    do {
      if ((pNtkF->vCis).nSize <= lVar4) {
LAB_003ad787:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar3 = (pNtkF->vCis).pArray[lVar4];
      if ((long)iVar3 < 1) {
LAB_003ad7a6:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                      ,0x10e,"char *Acb_ObjNameStr(Acb_Ntk_t *, int)");
      }
      iVar2 = (pNtkF->vObjName).nSize;
      if (iVar2 < 1) {
LAB_003ad7c5:
        __assert_fail("Acb_NtkHasObjNames(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                      ,0x10d,"int Acb_ObjName(Acb_Ntk_t *, int)");
      }
      if ((iVar2 <= iVar3) ||
         (__s1 = Abc_NamStr(pNtkF->pDesign->pStrs,(pNtkF->vObjName).pArray[iVar3]),
         (pNtkG->vCis).nSize <= lVar4)) goto LAB_003ad787;
      iVar3 = (pNtkG->vCis).pArray[lVar4];
      if ((long)iVar3 < 1) goto LAB_003ad7a6;
      iVar2 = (pNtkG->vObjName).nSize;
      if (iVar2 < 1) goto LAB_003ad7c5;
      if (iVar2 <= iVar3) goto LAB_003ad787;
      __s2 = Abc_NamStr(pNtkG->pDesign->pStrs,(pNtkG->vObjName).pArray[iVar3]);
      iVar3 = strcmp(__s1,__s2);
      if (iVar3 != 0) {
        puts("Networks have different PI names. Reordering PIs of the implementation network.");
        Acb_NtkUpdateCiOrder(pNtkF,pNtkG);
        break;
      }
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  if ((int)lVar4 == iVar1) {
    puts("Networks have the same PI names.");
  }
  return (int)((int)lVar4 == iVar1);
}

Assistant:

int Acb_NtkCheckPiOrder( Acb_Ntk_t * pNtkF, Acb_Ntk_t * pNtkG )
{
    int i, nPis = Acb_NtkCiNum(pNtkF);
    for ( i = 0; i < nPis; i++ )
    {
        char * pNameF = Acb_ObjNameStr( pNtkF, Acb_NtkCi(pNtkF, i) );
        char * pNameG = Acb_ObjNameStr( pNtkG, Acb_NtkCi(pNtkG, i) );
        if ( strcmp(pNameF, pNameG) )
        {
//            printf( "PI %d has different names (%s and %s) in these networks.\n", i, pNameF, pNameG );
            printf( "Networks have different PI names. Reordering PIs of the implementation network.\n" );
            Acb_NtkUpdateCiOrder( pNtkF, pNtkG );
            break;
        }
    }
    if ( i == nPis )
        printf( "Networks have the same PI names.\n" );
    return i == nPis;
}